

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlParserInputBufferCreateUrl
              (char *URI,xmlCharEncoding enc,int flags,xmlParserInputBufferPtr *out)

{
  code *pcVar1;
  xmlInputCloseCallback p_Var2;
  int __fd;
  int iVar3;
  xmlParserInputBufferPtr buf;
  long lVar4;
  void *pvVar5;
  int flags_00;
  int *piVar6;
  ulong uVar7;
  int fd;
  int local_34;
  
  xmlInitParser();
  *out = (xmlParserInputBufferPtr)0x0;
  if (URI == (char *)0x0) {
    iVar3 = 0x73;
  }
  else {
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == (xmlParserInputBufferPtr)0x0) {
      iVar3 = 2;
    }
    else {
      lVar4 = (long)xmlInputCallbackNr;
      iVar3 = 0x5f4;
      if (0 < lVar4) {
        uVar7 = lVar4 + 1;
        piVar6 = &xmlInputCallbackNr + lVar4 * 8;
        do {
          pcVar1 = *(code **)(piVar6 + -4);
          if (pcVar1 == xmlIODefaultMatch) {
            iVar3 = xmlFdOpen(URI,0,&local_34);
            __fd = local_34;
            if (iVar3 == 0) {
              iVar3 = xmlInputFromFd(buf,local_34,flags_00);
              close(__fd);
            }
            if (iVar3 != 0x5f4) {
              if (iVar3 == 0) goto LAB_0015e80d;
              goto LAB_0015e802;
            }
          }
          else if ((pcVar1 != (code *)0x0) && (iVar3 = (*pcVar1)(URI), iVar3 != 0)) {
            pvVar5 = (void *)(**(code **)(piVar6 + -2))(URI);
            buf->context = pvVar5;
            if (pvVar5 != (void *)0x0) {
              p_Var2 = *(xmlInputCloseCallback *)(piVar6 + 2);
              buf->readcallback = *(xmlInputReadCallback *)piVar6;
              buf->closecallback = p_Var2;
              iVar3 = 0;
              goto LAB_0015e80d;
            }
          }
          uVar7 = uVar7 - 1;
          piVar6 = piVar6 + -8;
        } while (1 < uVar7);
        iVar3 = 0x5f4;
      }
LAB_0015e802:
      xmlFreeParserInputBuffer(buf);
      buf = (xmlParserInputBufferPtr)0x0;
LAB_0015e80d:
      *out = buf;
    }
  }
  return iVar3;
}

Assistant:

int
xmlParserInputBufferCreateUrl(const char *URI, xmlCharEncoding enc,
                              int flags, xmlParserInputBufferPtr *out) {
    xmlParserInputBufferPtr buf;
    int ret;
    int i;

    xmlInitParser();

    *out = NULL;
    if (URI == NULL)
        return(XML_ERR_ARGUMENT);

    /*
     * Allocate the Input buffer front-end.
     */
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL)
        return(XML_ERR_NO_MEMORY);

    /*
     * Try to find one of the input accept method accepting that scheme
     * Go in reverse to give precedence to user defined handlers.
     */
    ret = XML_IO_ENOENT;
    for (i = xmlInputCallbackNr - 1; i >= 0; i--) {
        xmlInputCallback *cb = &xmlInputCallbackTable[i];

        if (cb->matchcallback == xmlIODefaultMatch) {
            ret = xmlInputDefaultOpen(buf, URI, flags);

            if ((ret == XML_ERR_OK) || (ret != XML_IO_ENOENT))
                break;
        } else if ((cb->matchcallback != NULL) &&
                   (cb->matchcallback(URI) != 0)) {
            buf->context = cb->opencallback(URI);
            if (buf->context != NULL) {
                buf->readcallback = cb->readcallback;
                buf->closecallback = cb->closecallback;
                ret = XML_ERR_OK;
                break;
            }
        }
    }
    if (ret != XML_ERR_OK) {
        xmlFreeParserInputBuffer(buf);
        *out = NULL;
	return(ret);
    }

    *out = buf;
    return(ret);
}